

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::GroupNode> *group,ssize_t id)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  XMLWriter *this_00;
  int in_EDX;
  long *in_RSI;
  XMLWriter *in_RDI;
  Ref<embree::SceneGraph::Node> *in_stack_000000f8;
  XMLWriter *in_stack_00000100;
  pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>
  *i_1;
  iterator __end1;
  iterator __begin1;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  *__range1;
  Ref<embree::SceneGraph::Node> child;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  size_t i;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  object_to_transform_map;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  *in_stack_fffffffffffffd38;
  _Rb_tree_iterator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>
  *in_stack_fffffffffffffd40;
  allocator *paVar4;
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  *in_stack_fffffffffffffd48;
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  *in_stack_fffffffffffffd50;
  key_type *in_stack_fffffffffffffd78;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  *in_stack_fffffffffffffd80;
  mapped_type *in_stack_fffffffffffffd88;
  mapped_type *in_stack_fffffffffffffd90;
  long *local_228;
  allocator local_1e1;
  string local_1e0 [48];
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  *in_stack_fffffffffffffe50;
  _Self local_1a0;
  _Self local_198;
  undefined1 *local_190;
  Node *local_188;
  int local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  _Self local_160;
  _Self local_158;
  undefined1 local_150 [8];
  long *local_148;
  _Base_ptr local_140;
  undefined1 local_138 [71];
  allocator local_f1;
  string local_f0 [32];
  int local_d0;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  *local_b8;
  Node **local_a8;
  long **local_98;
  long **local_90;
  long **local_88;
  long *local_80;
  long *local_78;
  undefined1 *local_70;
  reference local_68;
  Node **local_60;
  reference local_40;
  long **local_38;
  long **local_30;
  long **local_28;
  long *local_18;
  long *local_10;
  long **local_8;
  
  local_d0 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Group",&local_f1);
  open(in_RDI,(char *)local_f0,local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  ::map((map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
         *)0x3f85e0);
  local_140 = (_Base_ptr)0x0;
  do {
    p_Var1 = local_140;
    p_Var3 = (_Base_ptr)
             std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     *)(*in_RSI + 0x68));
    if (p_Var3 <= p_Var1) {
      local_190 = local_138;
      local_198._M_node =
           (_Base_ptr)
           std::
           map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
           ::begin(in_stack_fffffffffffffd38);
      local_1a0._M_node =
           (_Base_ptr)
           std::
           map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
           ::end(in_stack_fffffffffffffd38);
      while (bVar2 = std::operator!=(&local_198,&local_1a0), bVar2) {
        this_00 = (XMLWriter *)
                  std::
                  _Rb_tree_iterator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>
                               *)0x3f8d28);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::vector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        store(this_00,in_stack_fffffffffffffe50);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::~vector(in_stack_fffffffffffffd50);
        std::
        _Rb_tree_iterator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>
        ::operator++(in_stack_fffffffffffffd40);
      }
      paVar4 = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"Group",paVar4);
      close(in_RDI,(int)local_1e0);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      std::
      map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
      ::~map((map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
              *)0x3f8e12);
      return;
    }
    local_40 = std::
               vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)(*in_RSI + 0x68),(size_type)local_140);
    local_38 = &local_148;
    if (local_40->ptr == (Node *)0x0) {
      local_228 = (long *)0x0;
    }
    else {
      local_228 = (long *)__dynamic_cast(local_40->ptr,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::TransformNode::typeinfo,0);
    }
    local_8 = &local_148;
    local_10 = local_228;
    local_148 = local_228;
    if (local_228 != (long *)0x0) {
      (**(code **)(*local_228 + 0x10))();
    }
    local_30 = &local_148;
    if (local_148 == (long *)0x0) {
LAB_003f8ad0:
      local_17c = 0;
    }
    else {
      local_88 = &local_148;
      local_80 = local_148 + 0xd;
      local_18 = local_148 + 0xe;
      if ((local_148[0xf] != 1) || (local_90 = &local_148, local_148[10] != 1)) goto LAB_003f8ad0;
      local_98 = &local_148;
      local_78 = local_148 + 0x13;
      local_70 = local_150;
      local_150 = (undefined1  [8])*local_78;
      if (local_150 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_150 + 0x10))();
      }
      local_158._M_node =
           (_Base_ptr)
           std::
           map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
           ::find(in_stack_fffffffffffffd38,(key_type *)0x3f88aa);
      local_160._M_node =
           (_Base_ptr)
           std::
           map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
           ::end(in_stack_fffffffffffffd38);
      bVar2 = std::operator==(&local_158,&local_160);
      if (bVar2) {
        local_178 = 0;
        uStack_170 = 0;
        local_168 = 0;
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::vector((vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
                  *)0x3f8915);
        in_stack_fffffffffffffd90 =
             std::
             map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
             ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::~vector(in_stack_fffffffffffffd50);
      }
      in_stack_fffffffffffffd88 =
           std::
           map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
           ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::
      vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
      ::push_back(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      local_17c = 4;
      in_stack_fffffffffffffd80 =
           (map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
            *)local_150;
      local_b8 = in_stack_fffffffffffffd80;
      if (local_150 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_150 + 0x18))();
      }
    }
    local_28 = &local_148;
    if (local_148 != (long *)0x0) {
      (**(code **)(*local_148 + 0x18))();
    }
    if (local_17c == 0) {
      local_68 = std::
                 vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                 ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                               *)(*in_RSI + 0x68),(size_type)local_140);
      local_60 = &local_188;
      local_188 = local_68->ptr;
      if (local_188 != (Node *)0x0) {
        (*(local_188->super_RefCount)._vptr_RefCount[2])();
      }
      store(in_stack_00000100,in_stack_000000f8);
      local_a8 = &local_188;
      if (local_188 != (Node *)0x0) {
        (*(local_188->super_RefCount)._vptr_RefCount[3])();
      }
    }
    local_140 = (_Base_ptr)((long)&local_140->_M_color + 1);
  } while( true );
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::GroupNode> group, ssize_t id)
  {
    open("Group",id);

    std::map<Ref<SceneGraph::Node>,std::vector<Ref<SceneGraph::TransformNode>>> object_to_transform_map;
    for (size_t i=0; i<group->children.size(); i++)
    {
      /* compress transformation of the same object into MultiTransform nodes if possible */
      if (Ref<SceneGraph::TransformNode> xfmNode = group->children[i].dynamicCast<SceneGraph::TransformNode>())
      {
        /* we can only compress non-animated transform nodes and only ones that are referenced once */
        if (xfmNode->spaces.size() == 1 && xfmNode->indegree == 1) 
        {
          Ref<SceneGraph::Node> child = xfmNode->child;
          if (object_to_transform_map.find(child) == object_to_transform_map.end()) {
            object_to_transform_map[child] = std::vector<Ref<SceneGraph::TransformNode>>();
          }
          object_to_transform_map[child].push_back(xfmNode);
          continue;
        }
      }
      store(group->children[i]);
    }
    
    /* store all compressed transform nodes */
    for (auto& i : object_to_transform_map)
      store(i.second);

    close("Group");
  }